

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O1

google_protobuf_FieldDescriptorProto * fielddef_toproto(upb_ToProto_Context *ctx,upb_FieldDef *f)

{
  byte bVar1;
  upb_Arena *puVar2;
  bool bVar3;
  _Bool _Var4;
  uint32_t uVar5;
  google_protobuf_Edition gVar6;
  upb_Label uVar7;
  upb_FieldType uVar8;
  int iVar10;
  upb_DecodeStatus uVar11;
  char *pcVar12;
  size_t sVar13;
  upb_FileDef *puVar14;
  upb_MessageDef *puVar15;
  upb_EnumDef *puVar16;
  upb_CType uVar9;
  long lVar17;
  upb_EnumValueDef *v;
  upb_OneofDef *o;
  google_protobuf_FieldOptions *msg;
  google_protobuf_FieldDescriptorProto *__s;
  anon_union_8_2_9eb4e620_for_upb_Message_0 msg_00;
  byte *pbVar18;
  size_t sVar20;
  size_t sVar21;
  byte *pbVar22;
  ulong size_00;
  byte *pbVar23;
  size_t unaff_R13;
  upb_StringView str;
  upb_StringView str_00;
  upb_StringView uVar24;
  upb_MessageValue str_01;
  upb_StringView uVar25;
  char *ptr;
  size_t size;
  char *local_58;
  byte *local_50;
  upb_ToProto_Context *local_48;
  byte *local_40;
  size_t local_38;
  size_t sVar19;
  
  uVar25.size = unaff_R13;
  uVar25.data = local_58;
  puVar2 = ctx->arena;
  __s = (google_protobuf_FieldDescriptorProto *)puVar2->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)puVar2->end_dont_copy_me__upb_internal_use_only - (long)__s) < 0x78) {
    __s = (google_protobuf_FieldDescriptorProto *)
          _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar2,0x78);
  }
  else {
    if ((google_protobuf_FieldDescriptorProto *)
        ((ulong)((long)&(__s->base_dont_copy_me__upb_internal_use_only).field_0 + 7U) &
        0xfffffffffffffff8) != __s) goto LAB_0011960c;
    puVar2->ptr_dont_copy_me__upb_internal_use_only = (char *)(__s + 0xf);
  }
  if (__s == (google_protobuf_FieldDescriptorProto *)0x0) {
    __s = (google_protobuf_FieldDescriptorProto *)0x0;
  }
  else {
    memset(__s,0,0x78);
  }
  if (__s == (google_protobuf_FieldDescriptorProto *)0x0) goto LAB_0011963d;
  pcVar12 = upb_FieldDef_Name(f);
  sVar13 = strlen(pcVar12);
  uVar24.size = sVar13;
  uVar24.data = pcVar12;
  uVar24 = strviewdup2(ctx,uVar24);
  if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0) goto LAB_001195ed;
  *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
       *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 1;
  *(upb_StringView *)(__s + 4) = uVar24;
  uVar5 = upb_FieldDef_Number(f);
  if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0) goto LAB_001195ed;
  *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
       *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 4;
  *(uint32_t *)((long)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 + 4) = uVar5;
  _Var4 = upb_FieldDef_IsRequired(f);
  if (_Var4) {
    puVar14 = upb_FieldDef_File(f);
    gVar6 = upb_FileDef_Edition(puVar14);
    if (gVar6 < google_protobuf_EDITION_2023) goto LAB_0011905a;
    uVar7 = kUpb_Label_Optional;
  }
  else {
LAB_0011905a:
    uVar7 = upb_FieldDef_Label(f);
  }
  if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0) goto LAB_001195ed;
  *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
       *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 8;
  *(upb_Label *)&__s[2].base_dont_copy_me__upb_internal_use_only.field_0 = uVar7;
  uVar8 = upb_FieldDef_Type(f);
  if (uVar8 == kUpb_FieldType_Group) {
    puVar14 = upb_FieldDef_File(f);
    gVar6 = upb_FileDef_Edition(puVar14);
    if (gVar6 < google_protobuf_EDITION_2023) goto LAB_001190a0;
    uVar8 = kUpb_FieldType_Message;
  }
  else {
LAB_001190a0:
    uVar8 = upb_FieldDef_Type(f);
  }
  if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0) goto LAB_001195ed;
  *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
       *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 0x10;
  *(upb_FieldType *)((long)&__s[2].base_dont_copy_me__upb_internal_use_only.field_0 + 4) = uVar8;
  _Var4 = upb_FieldDef_HasJsonName(f);
  if (_Var4) {
    pcVar12 = upb_FieldDef_JsonName(f);
    sVar13 = strlen(pcVar12);
    str.size = sVar13;
    str.data = pcVar12;
    uVar24 = strviewdup2(ctx,str);
    if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
    goto LAB_001195ed;
    pbVar23 = (byte *)((long)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 + 1);
    *pbVar23 = *pbVar23 | 2;
    *(upb_StringView *)(__s + 0xd) = uVar24;
  }
  _Var4 = upb_FieldDef_IsSubMessage(f);
  if (_Var4) {
    puVar15 = upb_FieldDef_MessageSubDef(f);
    pcVar12 = upb_MessageDef_FullName(puVar15);
LAB_00119137:
    uVar24 = qual_dup(ctx,pcVar12);
    if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
    goto LAB_001195ed;
    *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 0x20;
    *(upb_StringView *)(__s + 8) = uVar24;
  }
  else {
    uVar9 = upb_FieldDef_CType(f);
    if (uVar9 == kUpb_CType_Enum) {
      puVar16 = upb_FieldDef_EnumSubDef(f);
      pcVar12 = upb_EnumDef_FullName(puVar16);
      goto LAB_00119137;
    }
  }
  _Var4 = upb_FieldDef_IsExtension(f);
  if (_Var4) {
    puVar15 = upb_FieldDef_ContainingType(f);
    pcVar12 = upb_MessageDef_FullName(puVar15);
    uVar24 = qual_dup(ctx,pcVar12);
    if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
    goto LAB_001195ed;
    *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 2;
    *(upb_StringView *)(__s + 6) = uVar24;
  }
  _Var4 = upb_FieldDef_HasDefault(f);
  if (!_Var4) goto LAB_00119466;
  str_01 = upb_FieldDef_Default(f);
  sVar19 = str_01.str_val.size;
  pbVar23 = str_01._0_8_;
  local_50 = pbVar23;
  uVar9 = upb_FieldDef_CType(f);
  if ((uVar9 == kUpb_CType_Double) || (uVar9 == kUpb_CType_Float)) {
    pbVar18 = local_50;
    if (uVar9 == kUpb_CType_Float) {
      pbVar18 = (byte *)(double)local_50._0_4_;
    }
    if ((double)pbVar18 < INFINITY) {
      if ((double)pbVar18 <= -INFINITY) {
        pcVar12 = "-inf";
        sVar20 = 4;
        goto LAB_00119211;
      }
      if (NAN((double)pbVar18)) {
        pcVar12 = "nan";
        goto LAB_001191f0;
      }
      bVar3 = true;
    }
    else {
      pcVar12 = "inf";
LAB_001191f0:
      sVar20 = 3;
LAB_00119211:
      str_00.size = sVar20;
      str_00.data = pcVar12;
      uVar25 = strviewdup2(ctx,str_00);
      bVar3 = false;
    }
    if (bVar3) goto LAB_0011922b;
    goto LAB_0011944a;
  }
LAB_0011922b:
  uVar9 = upb_FieldDef_CType(f);
  switch(uVar9) {
  case kUpb_CType_Bool:
    pcVar12 = "false";
    if (((ulong)local_50 & 1) != 0) {
      pcVar12 = "true";
    }
    str_01.str_val.size = (ulong)((byte)local_50 & 1) ^ 5;
    str_01.str_val.data = pcVar12;
    break;
  case kUpb_CType_Float:
    pbVar23 = (byte *)(double)local_50._0_4_;
    pcVar12 = "%.9g";
    goto LAB_001193f5;
  case kUpb_CType_Int32:
    pcVar12 = "%d";
    goto LAB_00119422;
  case kUpb_CType_UInt32:
    pcVar12 = "%u";
LAB_00119422:
    uVar25 = printf_dup(ctx,pcVar12,(ulong)local_50 & 0xffffffff);
    goto LAB_0011944a;
  case kUpb_CType_Enum:
    puVar16 = upb_FieldDef_EnumSubDef(f);
    v = upb_EnumDef_FindValueByNumber(puVar16,(int32_t)local_50._0_4_);
    pcVar12 = upb_EnumValueDef_Name(v);
    sVar13 = strlen(pcVar12);
    str_01.str_val.size = sVar13;
    str_01.str_val.data = pcVar12;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/util/def_to_proto.c"
                  ,0xb7,"upb_StringView default_string(upb_ToProto_Context *, const upb_FieldDef *)"
                 );
  case kUpb_CType_Double:
    pcVar12 = "%.17g";
    pbVar23 = local_50;
LAB_001193f5:
    uVar25 = printf_dup(ctx,pcVar12,pbVar23);
    goto LAB_0011944a;
  case kUpb_CType_Int64:
    pcVar12 = "%ld";
    goto LAB_00119435;
  case kUpb_CType_UInt64:
    pcVar12 = "%lu";
LAB_00119435:
    uVar25 = printf_dup(ctx,pcVar12,pbVar23);
    goto LAB_0011944a;
  case kUpb_CType_String:
    break;
  case kUpb_CType_Bytes:
    sVar20 = 0;
    local_48 = ctx;
    if (sVar19 != 0) {
      sVar21 = 0;
      do {
        bVar1 = pbVar23[sVar21];
        iVar10 = special_escape(bVar1);
        lVar17 = (ulong)((char)bVar1 < ' ') * 3 + 1;
        if (-1 < iVar10) {
          lVar17 = 2;
        }
        sVar20 = sVar20 + lVar17;
        sVar21 = sVar21 + 1;
      } while (sVar19 != sVar21);
    }
    puVar2 = local_48->arena;
    size_00 = sVar20 + 7 & 0xfffffffffffffff8;
    pbVar18 = (byte *)puVar2->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)puVar2->end_dont_copy_me__upb_internal_use_only - (long)pbVar18) < size_00) {
      pbVar18 = (byte *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar2,size_00);
    }
    else {
      if ((byte *)((ulong)(pbVar18 + 7) & 0xfffffffffffffff8) != pbVar18) goto LAB_0011960c;
      puVar2->ptr_dont_copy_me__upb_internal_use_only = (char *)(pbVar18 + size_00);
    }
    ctx = local_48;
    if (pbVar18 == (byte *)0x0) goto LAB_0011963d;
    if (0 < (long)sVar19) {
      local_40 = pbVar23 + sVar19;
      pbVar22 = pbVar18;
      do {
        bVar1 = *pbVar23;
        iVar10 = special_escape(bVar1);
        if (iVar10 < 0) {
          if ((char)bVar1 < ' ') {
            *pbVar22 = 0x5c;
            pbVar22[1] = bVar1 >> 6 | 0x30;
            pbVar22[2] = bVar1 >> 3 & 7 | 0x30;
            pbVar22[3] = bVar1 & 7 | 0x30;
            pbVar22 = pbVar22 + 4;
          }
          else {
            *pbVar22 = bVar1;
            pbVar22 = pbVar22 + 1;
          }
        }
        else {
          *pbVar22 = 0x5c;
          pbVar22[1] = (byte)iVar10;
          pbVar22 = pbVar22 + 2;
        }
        pbVar23 = pbVar23 + 1;
      } while (pbVar23 < local_40);
    }
    uVar25.size = sVar20;
    uVar25.data = (char *)pbVar18;
    ctx = local_48;
    goto LAB_0011944a;
  }
  uVar25 = strviewdup2(ctx,str_01.str_val);
LAB_0011944a:
  if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
    *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 0x40;
    *(upb_StringView *)(__s + 10) = uVar25;
LAB_00119466:
    o = upb_FieldDef_ContainingOneof(f);
    if (o != (upb_OneofDef *)0x0) {
      uVar5 = upb_OneofDef_Index(o);
      if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
      goto LAB_001195ed;
      pbVar23 = (byte *)((long)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 + 1);
      *pbVar23 = *pbVar23 | 1;
      *(uint32_t *)&__s[3].base_dont_copy_me__upb_internal_use_only.field_0 = uVar5;
    }
    _Var4 = _upb_FieldDef_IsProto3Optional(f);
    if (_Var4) {
      if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
      goto LAB_001195ed;
      pbVar23 = (byte *)((long)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 + 1);
      *pbVar23 = *pbVar23 | 4;
      *(char *)((long)&__s[3].base_dont_copy_me__upb_internal_use_only.field_0 + 4) = '\x01';
    }
    _Var4 = upb_FieldDef_HasOptions(f);
    if (!_Var4) {
      return __s;
    }
    msg = upb_FieldDef_Options(f);
    upb_Encode(&msg->base_dont_copy_me__upb_internal_use_only,
               &google__protobuf__FieldOptions_msg_init,0,ctx->arena,(char **)&local_50,&local_38);
    pbVar23 = local_50;
    if (local_50 != (byte *)0x0) {
      puVar2 = ctx->arena;
      msg_00.internal_opaque = (uintptr_t)puVar2->ptr_dont_copy_me__upb_internal_use_only;
      local_48 = ctx;
      if ((ulong)((long)puVar2->end_dont_copy_me__upb_internal_use_only - (long)msg_00) < 0x48) {
        msg_00 = (anon_union_8_2_9eb4e620_for_upb_Message_0)
                 _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar2,0x48);
      }
      else {
        if ((char *)((ulong)(msg_00.internal_opaque + 7) & 0xfffffffffffffff8) !=
            (char *)msg_00.internal_opaque) {
LAB_0011960c:
          __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mem/internal/arena.h"
                        ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
        }
        puVar2->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg_00.internal_opaque + 0x48);
      }
      if ((char *)msg_00.internal_opaque == (char *)0x0) {
        msg_00.internal_opaque = 0;
      }
      else {
        memset((void *)msg_00,0,0x48);
      }
      if (msg_00.internal_opaque == 0) {
        msg_00.internal_opaque = 0;
      }
      else {
        uVar11 = upb_Decode((char *)pbVar23,local_38,(upb_Message *)msg_00,
                            &google__protobuf__FieldOptions_msg_init,(upb_ExtensionRegistry *)0x0,0,
                            puVar2);
        if (uVar11 != kUpb_DecodeStatus_Ok) {
          msg_00.internal_opaque = 0;
        }
      }
      ctx = local_48;
      if ((anon_union_8_2_9eb4e620_for_upb_Message_0)msg_00.internal_opaque !=
          (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) {
        if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
          *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
               *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 0x80;
          *(anon_union_8_2_9eb4e620_for_upb_Message_0 *)(__s + 0xc) = msg_00;
          return __s;
        }
        goto LAB_001195ed;
      }
    }
LAB_0011963d:
    longjmp((__jmp_buf_tag *)ctx->err,1);
  }
LAB_001195ed:
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/internal/accessors.h"
                ,0x13b,
                "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
               );
}

Assistant:

static google_protobuf_FieldDescriptorProto* fielddef_toproto(upb_ToProto_Context* ctx,
                                                     const upb_FieldDef* f) {
  google_protobuf_FieldDescriptorProto* proto =
      google_protobuf_FieldDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_FieldDescriptorProto_set_name(proto,
                                       strviewdup(ctx, upb_FieldDef_Name(f)));
  google_protobuf_FieldDescriptorProto_set_number(proto, upb_FieldDef_Number(f));

  if (upb_FieldDef_IsRequired(f) &&
      upb_FileDef_Edition(upb_FieldDef_File(f)) >= UPB_DESC(EDITION_2023)) {
    google_protobuf_FieldDescriptorProto_set_label(
        proto, UPB_DESC(FieldDescriptorProto_LABEL_OPTIONAL));
  } else {
    google_protobuf_FieldDescriptorProto_set_label(proto, upb_FieldDef_Label(f));
  }
  if (upb_FieldDef_Type(f) == kUpb_FieldType_Group &&
      upb_FileDef_Edition(upb_FieldDef_File(f)) >= UPB_DESC(EDITION_2023)) {
    google_protobuf_FieldDescriptorProto_set_type(proto, kUpb_FieldType_Message);
  } else {
    google_protobuf_FieldDescriptorProto_set_type(proto, upb_FieldDef_Type(f));
  }

  if (upb_FieldDef_HasJsonName(f)) {
    google_protobuf_FieldDescriptorProto_set_json_name(
        proto, strviewdup(ctx, upb_FieldDef_JsonName(f)));
  }

  if (upb_FieldDef_IsSubMessage(f)) {
    google_protobuf_FieldDescriptorProto_set_type_name(
        proto,
        qual_dup(ctx, upb_MessageDef_FullName(upb_FieldDef_MessageSubDef(f))));
  } else if (upb_FieldDef_CType(f) == kUpb_CType_Enum) {
    google_protobuf_FieldDescriptorProto_set_type_name(
        proto, qual_dup(ctx, upb_EnumDef_FullName(upb_FieldDef_EnumSubDef(f))));
  }

  if (upb_FieldDef_IsExtension(f)) {
    google_protobuf_FieldDescriptorProto_set_extendee(
        proto,
        qual_dup(ctx, upb_MessageDef_FullName(upb_FieldDef_ContainingType(f))));
  }

  if (upb_FieldDef_HasDefault(f)) {
    google_protobuf_FieldDescriptorProto_set_default_value(proto,
                                                  default_string(ctx, f));
  }

  const upb_OneofDef* o = upb_FieldDef_ContainingOneof(f);
  if (o) {
    google_protobuf_FieldDescriptorProto_set_oneof_index(proto, upb_OneofDef_Index(o));
  }

  if (_upb_FieldDef_IsProto3Optional(f)) {
    google_protobuf_FieldDescriptorProto_set_proto3_optional(proto, true);
  }

  if (upb_FieldDef_HasOptions(f)) {
    SET_OPTIONS(proto, FieldDescriptorProto, FieldOptions,
                upb_FieldDef_Options(f));
  }

  return proto;
}